

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O2

void unset_spells(bitflag *spells,bitflag *flags,bitflag *pflags,element_info *el,
                 monster_conflict *mon)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  char *pcVar4;
  _Bool _Var5;
  _Bool _Var6;
  ushort uVar7;
  uint32_t uVar8;
  monster_spell *pmVar9;
  int flag;
  effect *peVar10;
  size_t size;
  bitflag *flags_00;
  timed_failure *ptVar11;
  mon_spell_info *pmVar12;
  
  _Var5 = monster_is_smart((monster *)mon);
  iVar3 = 0x19;
  if (_Var5) {
    iVar3 = 0x32;
  }
  pmVar12 = mon_spell_types;
  do {
    uVar1 = pmVar12->index;
    if (0x5b < uVar1) {
      return;
    }
    pmVar9 = monster_spell_by_index((uint)uVar1);
    if ((pmVar9 != (monster_spell *)0x0) &&
       (_Var6 = flag_has_dbg(spells,0xc,(uint)uVar1,"spells","info->index"), _Var6)) {
      peVar10 = pmVar9->effect;
      if ((pmVar12->type & 7) == 0) {
LAB_00171af6:
        if (peVar10 != (effect *)0x0) {
          if ((_Var5) || (uVar8 = Rand_div(3), uVar8 != 0)) {
            if (peVar10->index == 10) {
              if (0x34 < (ulong)(uint)peVar10->subtype) {
                __assert_fail("effect->subtype >= 0 && effect->subtype < TMD_MAX",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-spell.c"
                              ,0x1f8,
                              "void unset_spells(bitflag *, bitflag *, bitflag *, struct element_info *, const struct monster *)"
                             );
              }
              ptVar11 = (timed_failure *)&timed_effects[(uint)peVar10->subtype].fail;
              uVar7 = 0;
switchD_00171b65_default:
              ptVar11 = ptVar11->next;
              if ((ptVar11 == (timed_failure *)0x0) || (uVar7 != 0)) break;
              uVar7 = 0;
              switch(ptVar11->code) {
              case 1:
                flag = ptVar11->idx;
                size = 5;
                pcVar4 = "save str flags";
                flags_00 = flags;
                break;
              case 2:
                uVar7 = (ushort)(0 < el[ptVar11->idx].res_level);
                goto switchD_00171b65_default;
              case 3:
                uVar7 = (ushort)el[ptVar11->idx].res_level >> 0xf;
                goto switchD_00171b65_default;
              case 4:
                flag = ptVar11->idx;
                size = 3;
                pcVar4 = "p->state.pflags";
                flags_00 = pflags;
                break;
              default:
                goto switchD_00171b65_default;
              }
              _Var6 = flag_has_dbg(flags_00,size,flag,pcVar4 + 9,"f->idx");
              uVar7 = (ushort)_Var6;
              goto switchD_00171b65_default;
            }
            goto LAB_00171bcf;
          }
          goto LAB_00171bd4;
        }
        goto LAB_00171aeb;
      }
      sVar2 = el[peVar10->subtype].res_level;
      uVar8 = Rand_div(100);
      if ((int)uVar8 < sVar2 * iVar3) {
LAB_00171adb:
        flag_off(spells,0xc,(uint)uVar1);
      }
    }
LAB_00171aeb:
    pmVar12 = pmVar12 + 1;
  } while( true );
  if (uVar7 != 0) goto LAB_00171adb;
LAB_00171bcf:
  if (!_Var5) {
LAB_00171bd4:
    uVar8 = Rand_div(2);
    if (uVar8 != 0) goto LAB_00171c0d;
  }
  if ((peVar10->index == 0x17) && (_Var6 = flag_has_dbg(pflags,3,10,"pflags","PF_NO_MANA"), _Var6))
  goto LAB_00171adb;
LAB_00171c0d:
  peVar10 = peVar10->next;
  goto LAB_00171af6;
}

Assistant:

void unset_spells(bitflag *spells, bitflag *flags, bitflag *pflags,
				  struct element_info *el, const struct monster *mon)
{
	const struct mon_spell_info *info;
	bool smart = monster_is_smart(mon);

	for (info = mon_spell_types; info->index < RSF_MAX; info++) {
		const struct monster_spell *spell = monster_spell_by_index(info->index);
		const struct effect *effect;

		/* Ignore missing spells */
		if (!spell) continue;
		if (!rsf_has(spells, info->index)) continue;

		/* Get the effect */
		effect = spell->effect;

		/* First we test the elemental spells */
		if (info->type & (RST_BOLT | RST_BALL | RST_BREATH)) {
			int element = effect->subtype;
			int learn_chance = el[element].res_level * (smart ? 50 : 25);
			if (randint0(100) < learn_chance) {
				rsf_off(spells, info->index);
			}
		} else {
			/* Now others with resisted effects */
			while (effect) {
				/* Timed effects */
				if ((smart || !one_in_(3))
						&& effect->index == EF_TIMED_INC) {
					const struct timed_failure *f;
					bool resisted = false;

					assert(effect->subtype >= 0
						&& effect->subtype < TMD_MAX);
					for (f = timed_effects[effect->subtype].fail;
							f && !resisted;
							f = f->next) {
						switch (f->code) {
						case TMD_FAIL_FLAG_OBJECT:
							if (of_has(flags, f->idx)) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_RESIST:
							if (el[f->idx].res_level > 0) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_VULN:
							if (el[f->idx].res_level < 0) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_PLAYER:
							if (pf_has(pflags, f->idx)) {
								resisted = true;
							}
							break;

						/*
						 * The monster doesn't track
						 * the timed effects present
						 * on the player so do
						 * nothing with resistances
						 * due to those.
						 */
						case TMD_FAIL_FLAG_TIMED_EFFECT:
							break;
						}
					}
					if (resisted) {
						break;
					}
				}

				/* Mana drain */
				if ((smart || one_in_(2)) &&
						effect->index == EF_DRAIN_MANA &&
						pf_has(pflags, PF_NO_MANA))
					break;

				effect = effect->next;
			}
			if (effect)
				rsf_off(spells, info->index);
		}
	}
}